

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateObjectTypeToDebugReportObjectType_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_182;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_181;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 local_138 [64];
  string local_f8;
  reference local_d8;
  ExtensionData *extension;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  *__range1_1;
  reference local_98;
  FeatureData *feature;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  *__range1;
  string objectTypeCases;
  anon_class_8_1_8991fb9c generateObjectTypeCases;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string objectTypeToDebugReportObjectTypeTemplate;
  VulkanHppGenerator *this_local;
  
  objectTypeToDebugReportObjectTypeTemplate.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "\n  //===========================================================\n  //=== Mapping from ObjectType to DebugReportObjectTypeEXT ===\n  //===========================================================\n\n  VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT debugReportObjectType( VULKAN_HPP_NAMESPACE::ObjectType objectType )\n  {\n    switch( objectType )\n    {\n${objectTypeCases}\n      default:\n        VULKAN_HPP_ASSERT( false && \"unknown ObjectType\" );\n        return VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT::eUnknown;\n    }\n  }\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  objectTypeCases.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ::begin(&this->m_features);
  feature = (FeatureData *)
            std::
            vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
            ::end(&this->m_features);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
                      (&__end1,(__normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
                                *)&feature);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_98 = __gnu_cxx::
               __normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
               ::operator*(&__end1);
    generateObjectTypeToDebugReportObjectType::anon_class_8_1_8991fb9c::operator()
              ((string *)&__range1_1,(anon_class_8_1_8991fb9c *)((long)&objectTypeCases.field_2 + 8)
               ,&local_98->requireData,&local_98->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
             ::begin(&this->m_extensions);
  extension = (ExtensionData *)
              std::
              vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ::end(&this->m_extensions);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                      (&__end1_1,
                       (__normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                        *)&extension);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_d8 = __gnu_cxx::
               __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
               ::operator*(&__end1_1);
    generateObjectTypeToDebugReportObjectType::anon_class_8_1_8991fb9c::operator()
              (&local_f8,(anon_class_8_1_8991fb9c *)((long)&objectTypeCases.field_2 + 8),
               &local_d8->requireData,&local_d8->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
               &local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
    ::operator++(&__end1_1);
  }
  local_180 = &local_178;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_180,(char (*) [16])"objectTypeCases",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  local_138._0_8_ = &local_178;
  local_138._8_8_ = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_182);
  __l._M_len = local_138._8_8_;
  __l._M_array = (iterator)local_138._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(local_138 + 0x10),__l,&local_181,&local_182);
  replaceWithMap(__return_storage_ptr__,(string *)local_38,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_138 + 0x10));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_138 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_182);
  local_1b8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_138;
  do {
    local_1b8 = local_1b8 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_1b8);
  } while (local_1b8 != &local_178);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateObjectTypeToDebugReportObjectType() const
{
  auto objectTypeToDebugReportObjectTypeTemplate = std::string{ R"(
  //===========================================================
  //=== Mapping from ObjectType to DebugReportObjectTypeEXT ===
  //===========================================================

  VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT debugReportObjectType( VULKAN_HPP_NAMESPACE::ObjectType objectType )
  {
    switch( objectType )
    {
${objectTypeCases}
      default:
        VULKAN_HPP_ASSERT( false && "unknown ObjectType" );
        return VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT::eUnknown;
    }
  }
)" };

  auto const generateObjectTypeCases = [this]( std::vector<RequireData> const & requireData, std::string const & title )
  {
    static const std::string objectTypeCaseTemplate =
      "      case VULKAN_HPP_NAMESPACE::ObjectType::${objectType} : return VULKAN_HPP_NAMESPACE::DebugReportObjectTypeEXT::${debugReportObjectType};\n";

    std::string objectTypeCases;
    for ( auto const & require : requireData )
    {
      for ( auto const & type : require.types )
      {
        auto handleIt = m_handles.find( type.name );
        if ( handleIt != m_handles.end() )
        {
          objectTypeCases += replaceWithMap( objectTypeCaseTemplate,
                                             { { "debugReportObjectType", generateDebugReportObjectType( handleIt->second.objTypeEnum ) },
                                               { "objectType", generateEnumValueName( "VkObjectType", handleIt->second.objTypeEnum, false ) } } );
        }
      }
    }
    return addTitleAndProtection( title, objectTypeCases );
  };

  std::string objectTypeCases;
  for ( auto const & feature : m_features )
  {
    objectTypeCases += generateObjectTypeCases( feature.requireData, feature.name );
  }
  for ( auto const & extension : m_extensions )
  {
    objectTypeCases += generateObjectTypeCases( extension.requireData, extension.name );
  }

  return replaceWithMap( objectTypeToDebugReportObjectTypeTemplate, { { "objectTypeCases", objectTypeCases } } );
}